

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParsePackage
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  string identifier;
  LocationRecorder location;
  
  if (((file->_has_bits_).has_bits_[0] & 2) != 0) {
    std::__cxx11::string::string
              ((string *)&identifier,"Multiple package definitions.",(allocator *)&location);
    AddError(this,&identifier);
    std::__cxx11::string::~string((string *)&identifier);
    FileDescriptorProto::clear_package(file);
  }
  LocationRecorder::LocationRecorder(&location,root_location,2);
  LocationRecorder::RecordLegacyLocation(&location,&file->super_Message,NAME);
  bVar1 = Consume(this,"package");
  if (bVar1) {
    while( true ) {
      identifier._M_string_length = 0;
      identifier.field_2._M_local_buf[0] = '\0';
      identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
      bVar1 = ConsumeIdentifier(this,&identifier,"Expected identifier.");
      if (!bVar1) break;
      psVar2 = FileDescriptorProto::_internal_mutable_package_abi_cxx11_(file);
      std::__cxx11::string::append((string *)psVar2);
      bVar1 = TryConsume(this,".");
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&identifier);
        bVar1 = ConsumeEndOfDeclaration(this,";",&location);
        goto LAB_0034f947;
      }
      psVar2 = FileDescriptorProto::_internal_mutable_package_abi_cxx11_(file);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::~string((string *)&identifier);
    }
    std::__cxx11::string::~string((string *)&identifier);
  }
  bVar1 = false;
LAB_0034f947:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParsePackage(FileDescriptorProto* file,
                          const LocationRecorder& root_location,
                          const FileDescriptorProto* containing_file) {
  if (file->has_package()) {
    AddError("Multiple package definitions.");
    // Don't append the new package to the old one.  Just replace it.  Not
    // that it really matters since this is an error anyway.
    file->clear_package();
  }

  LocationRecorder location(root_location,
                            FileDescriptorProto::kPackageFieldNumber);
  location.RecordLegacyLocation(file, DescriptorPool::ErrorCollector::NAME);

  DO(Consume("package"));

  while (true) {
    std::string identifier;
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    file->mutable_package()->append(identifier);
    if (!TryConsume(".")) break;
    file->mutable_package()->append(".");
  }

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}